

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O1

void check_tensor(ggml_tensor *t,float *expected_t_d,int ne0,int ne1,int ne2)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  ulong local_60;
  
  if (t->type != GGML_TYPE_F32) goto LAB_00101891;
  if (t->ne[0] == (long)ne0) {
    if (t->ne[1] == (long)ne1) {
      if (t->ne[2] == (long)ne2) {
        if (0 < ne2) {
          iVar3 = 0;
          local_60 = 0;
          do {
            if (0 < ne1) {
              lVar8 = (long)iVar3 << 2;
              uVar6 = 0;
              do {
                if (0 < ne0) {
                  uVar9 = 0;
                  do {
                    fVar1 = *(float *)((long)expected_t_d + uVar9 * 4 + lVar8);
                    lVar4 = ggml_get_data_f32(t);
                    fVar2 = *(float *)(lVar4 + lVar8 + uVar9 * 4);
                    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
                      printf("expected %.1f, got %.1f at (%d,%d,%d)\n",(double)fVar1,(double)fVar2,
                             uVar9 & 0xffffffff,uVar6 & 0xffffffff,local_60);
                    }
                    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
                      pcVar5 = "expected == actual";
                      uVar7 = 0x30;
                      goto LAB_0010188a;
                    }
                    uVar9 = uVar9 + 1;
                  } while ((uint)ne0 != uVar9);
                }
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + (long)ne0 * 4;
              } while (uVar6 != (uint)ne1);
            }
            local_60 = local_60 + 1;
            iVar3 = iVar3 + ne1 * ne0;
          } while (local_60 != (uint)ne2);
        }
        return;
      }
      pcVar5 = "t->ne[2] == ne2";
      uVar7 = 0x27;
    }
    else {
      pcVar5 = "t->ne[1] == ne1";
      uVar7 = 0x26;
    }
  }
  else {
    pcVar5 = "t->ne[0] == ne0";
    uVar7 = 0x25;
  }
LAB_0010188a:
  do {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,uVar7,"GGML_ASSERT(%s) failed",pcVar5);
LAB_00101891:
    pcVar5 = "t->type == GGML_TYPE_F32";
    uVar7 = 0x24;
  } while( true );
}

Assistant:

void check_tensor(struct ggml_tensor * t, float * expected_t_d, int ne0, int ne1, int ne2) {
    GGML_ASSERT(t->type == GGML_TYPE_F32);
    GGML_ASSERT(t->ne[0] == ne0);
    GGML_ASSERT(t->ne[1] == ne1);
    GGML_ASSERT(t->ne[2] == ne2);
    for (int i2 = 0; i2 < ne2; ++i2) {
        for (int i1 = 0; i1 < ne1; ++i1) {
            for (int i0 = 0; i0 < ne0; ++i0) {
                float expected = *(expected_t_d + i2 * ne1 * ne0 + i1 * ne0 + i0);
                float actual = ggml_get_data_f32(t)[i2 * ne1 * ne0 + i1 * ne0 + i0];
                if (expected != actual) {
                    printf("expected %.1f, got %.1f at (%d,%d,%d)\n", expected, actual, i0, i1, i2);
                }
                GGML_ASSERT(expected == actual);
            }
        }
    }
}